

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_cli.c
# Opt level: O2

int mbedtls_ssl_handshake_client_step(mbedtls_ssl_context *ssl)

{
  mbedtls_key_exchange_type_t mVar1;
  mbedtls_ecp_group_id mVar2;
  mbedtls_x509_crt *pmVar3;
  mbedtls_ssl_config *pmVar4;
  int *piVar5;
  mbedtls_ecp_group_id *pmVar6;
  mbedtls_ssl_session *pmVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  uint5 uVar10;
  uchar uVar11;
  byte bVar12;
  ushort uVar13;
  ushort uVar14;
  int iVar15;
  int iVar16;
  mbedtls_pk_type_t type;
  mbedtls_pk_type_t mVar17;
  uint uVar18;
  size_t sVar19;
  mbedtls_ssl_key_cert *pmVar20;
  mbedtls_pk_context *pmVar21;
  mbedtls_ecp_curve_info *pmVar22;
  uchar *puVar23;
  mbedtls_md_info_t *pmVar24;
  mbedtls_ssl_ciphersuite_t *pmVar25;
  time_t tVar26;
  int *piVar27;
  size_t sVar28;
  int line;
  ushort *puVar29;
  uint uVar30;
  size_t sVar31;
  mbedtls_md_type_t mVar32;
  long lVar33;
  uint uVar34;
  char *pcVar35;
  mbedtls_mpi *X;
  ulong uVar36;
  ushort *end;
  ulong uVar37;
  uint *puVar38;
  uchar *puVar39;
  uchar *puVar40;
  char **ppcVar41;
  uchar *puVar42;
  mbedtls_ssl_handshake_params *pmVar43;
  ushort *puVar44;
  long lVar45;
  long lVar46;
  mbedtls_sha1_context *hash_00;
  ulong uVar47;
  bool bVar48;
  ulong uStackY_1b0;
  undefined8 in_stack_fffffffffffffe58;
  undefined4 uVar50;
  undefined8 uVar49;
  undefined8 in_stack_fffffffffffffe60;
  undefined4 uVar51;
  uchar *local_178;
  ushort *local_170;
  ushort *local_168;
  uchar *local_160;
  uchar *local_158;
  uchar *local_150;
  char *local_148;
  char *local_140;
  mbedtls_sha1_context mbedtls_sha1;
  mbedtls_md5_context mbedtls_md5;
  uchar hash [64];
  
  uVar51 = (undefined4)((ulong)in_stack_fffffffffffffe60 >> 0x20);
  iVar16 = -0x7100;
  if (ssl->state == 0x10) {
    return -0x7100;
  }
  if (ssl->handshake == (mbedtls_ssl_handshake_params *)0x0) {
    return -0x7100;
  }
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
             ,0xccf,"client state: %d");
  iVar15 = mbedtls_ssl_flush_output(ssl);
  if (iVar15 != 0) {
    return iVar15;
  }
  if ((((ssl->conf->field_0x174 & 2) != 0) && (ssl->handshake->retransmit_state == '\x01')) &&
     (iVar15 = mbedtls_ssl_resend(ssl), iVar15 != 0)) {
    return iVar15;
  }
  uVar50 = (undefined4)((ulong)in_stack_fffffffffffffe58 >> 0x20);
  uVar36 = (ulong)(uint)ssl->state;
  switch(uVar36) {
  case 0:
    ssl->state = 1;
    return 0;
  case 1:
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
               ,0x2cd,"=> write client hello");
    pmVar4 = ssl->conf;
    if (pmVar4->f_rng == (mbedtls_ssl_recv_t *)0x0) {
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                 ,0x2d1,"no RNG provided");
      return -0x7400;
    }
    if (ssl->renego_status == 0) {
      uVar13._0_1_ = pmVar4->min_major_ver;
      uVar13._1_1_ = pmVar4->min_minor_ver;
      uVar10 = CONCAT14(uVar13._1_1_,(uint)(uVar13 & 0xff));
      ssl->major_ver = (int)(ulong)uVar10;
      ssl->minor_ver = (int)((ulong)uVar10 >> 0x20);
    }
    if (pmVar4->max_major_ver == 0) {
      pcVar35 = 
      "configured max major version is invalid, consider using mbedtls_ssl_config_defaults()";
      iVar15 = 1;
      line = 0x2e0;
      goto LAB_00120bb2;
    }
    puVar40 = ssl->out_msg;
    mbedtls_ssl_write_version
              ((uint)pmVar4->max_major_ver,(uint)pmVar4->max_minor_ver,
               *(uint *)&pmVar4->field_0x174 >> 1 & 1,puVar40 + 4);
    uVar49 = CONCAT44(uVar50,(uint)puVar40[5]);
    mbedtls_debug_print_msg
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
               ,0x2f3,"client hello, max version: [%d:%d]",(ulong)puVar40[4],uVar49);
    pmVar43 = ssl->handshake;
    if (((ssl->conf->field_0x174 & 2) == 0) || (pmVar43->verify_cookie == (uchar *)0x0)) {
      tVar26 = time((time_t *)0x0);
      uVar18 = (uint)tVar26;
      *(uint *)pmVar43->randbytes =
           uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 | uVar18 << 0x18;
      mbedtls_debug_print_msg
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                 ,0x2b5,"client hello, current time: %lu",tVar26,uVar49);
      iVar16 = (*ssl->conf->f_rng)(ssl->conf->p_rng,pmVar43->randbytes + 4,0x1c);
      if (iVar16 != 0) {
        pcVar35 = "ssl_generate_random";
        iVar15 = 0x2f7;
        goto LAB_00120771;
      }
      pmVar43 = ssl->handshake;
    }
    uVar49 = *(undefined8 *)pmVar43->randbytes;
    uVar8 = *(undefined8 *)(pmVar43->randbytes + 8);
    uVar9 = *(undefined8 *)(pmVar43->randbytes + 0x18);
    *(undefined8 *)(puVar40 + 0x16) = *(undefined8 *)(pmVar43->randbytes + 0x10);
    *(undefined8 *)(puVar40 + 0x1e) = uVar9;
    *(undefined8 *)(puVar40 + 6) = uVar49;
    *(undefined8 *)(puVar40 + 0xe) = uVar8;
    mbedtls_debug_print_buf
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
               ,0x2fc,"client hello, random bytes",puVar40 + 6,0x20);
    pmVar7 = ssl->session_negotiate;
    sVar19 = pmVar7->id_len;
    if (sVar19 - 0x21 < 0xffffffffffffffef) {
      sVar19 = 0;
      if (ssl->renego_status == 0) {
LAB_0011fa7a:
        if ((pmVar7->ticket != (uchar *)0x0) && (pmVar7->ticket_len != 0)) {
          sVar19 = 0x20;
          iVar16 = (*ssl->conf->f_rng)(ssl->conf->p_rng,pmVar7->id,0x20);
          if (iVar16 != 0) {
            return iVar16;
          }
          ssl->session_negotiate->id_len = 0x20;
        }
      }
    }
    else {
      if (ssl->renego_status == 0) {
        if (ssl->handshake->resume == 0) {
          sVar19 = 0;
        }
        goto LAB_0011fa7a;
      }
      sVar19 = 0;
    }
    puVar40[0x26] = (uchar)sVar19;
    for (sVar31 = 0; sVar19 != sVar31; sVar31 = sVar31 + 1) {
      puVar40[sVar31 + 0x27] = ssl->session_negotiate->id[sVar31];
    }
    local_150 = puVar40;
    mbedtls_debug_print_msg
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
               ,0x331,"client hello, session id len.: %d",sVar19);
    mbedtls_debug_print_buf
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
               ,0x332,"client hello, session id",puVar40 + 0x27,sVar19);
    puVar40 = local_150;
    if ((ssl->conf->field_0x174 & 2) == 0) {
      puVar23 = local_150 + sVar31 + 0x27;
    }
    else {
      puVar23 = ssl->handshake->verify_cookie;
      if (puVar23 == (uchar *)0x0) {
        mbedtls_debug_print_msg
                  (ssl,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                   ,0x33c,"no verify cookie to send");
        puVar23 = puVar40 + sVar31 + 0x28;
        puVar40[sVar31 + 0x27] = '\0';
      }
      else {
        mbedtls_debug_print_buf
                  (ssl,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                   ,0x343,"client hello, cookie",puVar23,(ulong)ssl->handshake->verify_cookie_len);
        puVar40[sVar31 + 0x27] = ssl->handshake->verify_cookie_len;
        memcpy(puVar40 + sVar31 + 0x28,ssl->handshake->verify_cookie,
               (ulong)ssl->handshake->verify_cookie_len);
        puVar23 = puVar40 + ssl->handshake->verify_cookie_len + sVar31 + 0x28;
      }
    }
    puVar40 = puVar23 + 2;
    uVar36 = 0;
    for (puVar38 = (uint *)ssl->conf->ciphersuite_list[ssl->minor_ver]; *puVar38 != 0;
        puVar38 = puVar38 + 1) {
      pmVar25 = mbedtls_ssl_ciphersuite_from_id(*puVar38);
      if ((((pmVar25 != (mbedtls_ssl_ciphersuite_t *)0x0) &&
           (pmVar4 = ssl->conf, pmVar25->min_minor_ver <= (int)(uint)pmVar4->max_minor_ver)) &&
          ((int)(uint)pmVar4->min_minor_ver <= pmVar25->max_minor_ver)) &&
         ((((*(uint *)&pmVar4->field_0x174 & 2) == 0 || ((pmVar25->flags & 4) == 0)) &&
          (((*(uint *)&pmVar4->field_0x174 & 0x40) == 0 ||
           (pmVar25->cipher != MBEDTLS_CIPHER_ARC4_128)))))) {
        mbedtls_debug_print_msg
                  (ssl,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                   ,0x375,"client hello, add ciphersuite: %04x",(ulong)*puVar38);
        uVar36 = uVar36 + 1;
        *puVar40 = *(uchar *)((long)puVar38 + 1);
        puVar40[1] = (uchar)*puVar38;
        puVar40 = puVar40 + 2;
      }
    }
    if (ssl->renego_status == 0) {
      puVar40[0] = '\0';
      puVar40[1] = 0xff;
      puVar40 = puVar40 + 2;
      uVar36 = uVar36 + 1;
    }
    if ((ssl->conf->field_0x176 & 2) != 0) {
      mbedtls_debug_print_msg
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                 ,0x38c,"adding FALLBACK_SCSV");
      puVar40[0] = 'V';
      puVar40[1] = '\0';
      puVar40 = puVar40 + 2;
      uVar36 = uVar36 + 1;
    }
    *puVar23 = (uchar)(uVar36 >> 7);
    puVar23[1] = (char)uVar36 * '\x02';
    mbedtls_debug_print_msg
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
               ,0x396,"client hello, got %d ciphersuites",uVar36);
    mbedtls_debug_print_msg
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
               ,0x3b5,"client hello, compress len.: %d",1);
    mbedtls_debug_print_msg
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
               ,0x3b7,"client hello, compress alg.: %d",0);
    puVar40[0] = '\x01';
    puVar40[1] = '\0';
    puVar23 = puVar40 + 4;
    if (ssl->hostname == (char *)0x0) {
      uVar36 = 0;
    }
    else {
      puVar42 = ssl->out_msg;
      mbedtls_debug_print_msg
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                 ,0x48,"client hello, adding server name extension: %s");
      sVar28 = strlen(ssl->hostname);
      if ((puVar42 + 0x4000 < puVar23) ||
         (uVar36 = sVar28 + 9, (ulong)((long)(puVar42 + 0x4000) - (long)puVar23) < uVar36)) {
        uVar36 = 0;
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                   ,0x4e,"buffer too small");
      }
      else {
        puVar40[4] = '\0';
        puVar40[5] = '\0';
        puVar40[6] = (uchar)(sVar28 + 5 >> 8);
        puVar40[7] = (uchar)(sVar28 + 5);
        puVar40[8] = (uchar)(sVar28 + 3 >> 8);
        puVar40[9] = (uchar)(sVar28 + 3);
        puVar40[10] = '\0';
        puVar40[0xb] = (uchar)(sVar28 >> 8);
        puVar40[0xc] = (uchar)sVar28;
        memcpy(puVar40 + 0xd,ssl->hostname,sVar28);
      }
    }
    if (ssl->renego_status == 1) {
      puVar42 = puVar23 + uVar36;
      puVar39 = ssl->out_msg;
      mbedtls_debug_print_msg
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                 ,0x84,"client hello, adding renegotiation extension");
      if ((puVar39 + 0x4000 < puVar42) ||
         ((ulong)((long)(puVar39 + 0x4000) - (long)puVar42) < ssl->verify_data_len + 5)) {
        lVar33 = 0;
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                   ,0x88,"buffer too small");
      }
      else {
        puVar42[0] = 0xff;
        puVar42[1] = '\x01';
        puVar42[2] = '\0';
        puVar42[3] = (char)ssl->verify_data_len + '\x01';
        puVar42[4] = (uchar)ssl->verify_data_len;
        memcpy(puVar42 + 5,ssl->own_verify_data,ssl->verify_data_len);
        lVar33 = ssl->verify_data_len + 5;
      }
    }
    else {
      lVar33 = 0;
    }
    lVar33 = lVar33 + uVar36;
    if (ssl->conf->max_minor_ver == '\x03') {
      puVar39 = puVar23 + lVar33;
      puVar42 = ssl->out_msg;
      mbedtls_debug_print_msg
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                 ,0xb2,"client hello, adding signature_algorithms extension");
      piVar5 = ssl->conf->sig_hashes;
      for (uVar36 = 6; *(int *)((long)piVar5 + (uVar36 - 6)) != 0; uVar36 = uVar36 + 4) {
      }
      if ((puVar42 + 0x4000 < puVar39) ||
         ((ulong)((long)(puVar42 + 0x4000) - (long)puVar39) < uVar36)) {
        lVar45 = 0;
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                   ,0xc0,"buffer too small");
      }
      else {
        local_158 = puVar39;
        for (lVar45 = 0; *(int *)((long)piVar5 + lVar45) != 0; lVar45 = lVar45 + 4) {
          uVar11 = mbedtls_ssl_hash_from_md_alg(*(int *)((long)piVar5 + lVar45));
          puVar40[lVar45 + lVar33 + 10] = uVar11;
          puVar40[lVar45 + lVar33 + 0xb] = '\x03';
          uVar11 = mbedtls_ssl_hash_from_md_alg(*(int *)((long)piVar5 + lVar45));
          puVar40[lVar45 + lVar33 + 0xc] = uVar11;
          puVar40[lVar45 + lVar33 + 0xd] = '\x01';
        }
        local_158[0] = '\0';
        local_158[1] = '\r';
        uVar11 = (uchar)((ulong)lVar45 >> 8);
        local_158[2] = uVar11;
        local_158[3] = (uchar)lVar45 + '\x02';
        local_158[4] = uVar11;
        local_158[5] = (uchar)lVar45;
        lVar45 = lVar45 + 6;
      }
    }
    else {
      lVar45 = 0;
    }
    local_158 = puVar40 + 2;
    lVar45 = lVar45 + lVar33;
    puVar42 = puVar23 + lVar45;
    puVar39 = ssl->out_msg;
    mbedtls_debug_print_msg
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
               ,0x107,"client hello, adding supported_elliptic_curves extension");
    pmVar6 = ssl->conf->curve_list;
    uVar36 = 6;
    while (mVar2 = *(mbedtls_ecp_group_id *)((long)pmVar6 + uVar36 * 2 + -0xc),
          mVar2 != MBEDTLS_ECP_DP_NONE) {
      pmVar22 = mbedtls_ecp_curve_info_from_grp_id(mVar2);
      if (pmVar22 == (mbedtls_ecp_curve_info *)0x0) {
        pcVar35 = "invalid curve in ssl configuration";
        iVar16 = 0x113;
        goto LAB_0012022e;
      }
      uVar36 = uVar36 + 2;
    }
    if ((puVar39 + 0x4000 < puVar42) || ((ulong)((long)(puVar39 + 0x4000) - (long)puVar42) < uVar36)
       ) {
      pcVar35 = "buffer too small";
      iVar16 = 0x11c;
LAB_0012022e:
      lVar33 = 0;
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                 ,iVar16,pcVar35);
    }
    else {
      pmVar6 = ssl->conf->curve_list;
      lVar33 = 6;
      while (mVar2 = *(mbedtls_ecp_group_id *)((long)pmVar6 + lVar33 * 2 + -0xc),
            mVar2 != MBEDTLS_ECP_DP_NONE) {
        pmVar22 = mbedtls_ecp_curve_info_from_grp_id(mVar2);
        puVar40[lVar33 + lVar45 + 4] = *(uchar *)((long)&pmVar22->tls_id + 1);
        puVar40[lVar33 + lVar45 + 5] = (uchar)pmVar22->tls_id;
        lVar33 = lVar33 + 2;
      }
      if (lVar33 == 6) {
        lVar33 = 0;
      }
      else {
        puVar42[0] = '\0';
        puVar42[1] = '\n';
        puVar42[2] = (uchar)((ulong)(lVar33 + -4) >> 8);
        puVar42[3] = (uchar)(lVar33 + -4);
        puVar42[4] = (uchar)((ulong)(lVar33 + -6) >> 8);
        puVar42[5] = (char)lVar33 + 0xfa;
      }
    }
    puVar42 = puVar23 + lVar33 + lVar45;
    puVar39 = ssl->out_msg;
    mbedtls_debug_print_msg
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
               ,0x146,"client hello, adding supported_point_formats extension");
    if ((ulong)((long)(puVar39 + 0x4000) - (long)puVar42) < 6 || puVar39 + 0x4000 < puVar42) {
      lVar46 = 0;
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                 ,0x14a,"buffer too small");
    }
    else {
      puVar42[0] = '\0';
      puVar42[1] = '\v';
      puVar42[2] = '\0';
      puVar42[3] = '\x02';
      puVar42[4] = '\x01';
      puVar42[5] = '\0';
      lVar46 = 6;
    }
    lVar46 = lVar46 + lVar33 + lVar45;
    if ((*(ushort *)&ssl->conf->field_0x174 & 0x380) == 0) {
      lVar33 = 0;
    }
    else {
      puVar42 = puVar23 + lVar46;
      puVar39 = ssl->out_msg;
      mbedtls_debug_print_msg
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                 ,0x1b8,"client hello, adding max_fragment_length extension");
      if ((ulong)((long)(puVar39 + 0x4000) - (long)puVar42) < 5 || puVar39 + 0x4000 < puVar42) {
        lVar33 = 0;
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                   ,0x1bc,"buffer too small");
      }
      else {
        puVar42[0] = '\0';
        puVar42[1] = '\x01';
        puVar42[2] = '\0';
        puVar42[3] = '\x01';
        puVar42[4] = (byte)(*(uint *)&ssl->conf->field_0x174 >> 7) & 7;
        lVar33 = 5;
      }
    }
    lVar33 = lVar33 + lVar46;
    if ((ssl->conf->field_0x175 & 0x80) == 0) {
      lVar45 = 0;
    }
    else {
      puVar42 = puVar23 + lVar33;
      puVar39 = ssl->out_msg;
      mbedtls_debug_print_msg
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                 ,0x1da,"client hello, adding truncated_hmac extension");
      if ((ulong)((long)(puVar39 + 0x4000) - (long)puVar42) < 4 || puVar39 + 0x4000 < puVar42) {
        lVar45 = 0;
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                   ,0x1de,"buffer too small");
      }
      else {
        puVar42[0] = '\0';
        puVar42[1] = '\x04';
        puVar42[2] = '\0';
        puVar42[3] = '\0';
        lVar45 = 4;
      }
    }
    lVar45 = lVar45 + lVar33;
    if (((ssl->conf->field_0x175 & 4) == 0) || (ssl->conf->max_minor_ver == '\0')) {
      lVar33 = 0;
    }
    else {
      puVar42 = puVar23 + lVar45;
      puVar39 = ssl->out_msg;
      mbedtls_debug_print_msg
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                 ,0x1fc,"client hello, adding encrypt_then_mac extension");
      if ((ulong)((long)(puVar39 + 0x4000) - (long)puVar42) < 4 || puVar39 + 0x4000 < puVar42) {
        lVar33 = 0;
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                   ,0x200,"buffer too small");
      }
      else {
        puVar42[0] = '\0';
        puVar42[1] = '\x16';
        puVar42[2] = '\0';
        puVar42[3] = '\0';
        lVar33 = 4;
      }
    }
    lVar33 = lVar33 + lVar45;
    if (((ssl->conf->field_0x175 & 8) == 0) || (ssl->conf->max_minor_ver == '\0')) {
      uStackY_1b0 = 0;
    }
    else {
      puVar42 = puVar23 + lVar33;
      puVar39 = ssl->out_msg;
      mbedtls_debug_print_msg
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                 ,0x21e,"client hello, adding extended_master_secret extension");
      if ((ulong)((long)(puVar39 + 0x4000) - (long)puVar42) < 4 || puVar39 + 0x4000 < puVar42) {
        uStackY_1b0 = 0;
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                   ,0x222,"buffer too small");
      }
      else {
        puVar42[0] = '\0';
        puVar42[1] = '\x17';
        puVar42[2] = '\0';
        puVar42[3] = '\0';
        uStackY_1b0 = 4;
      }
    }
    lVar33 = uStackY_1b0 + lVar33;
    if (ssl->conf->alpn_list == (char **)0x0) {
      lVar45 = 0;
    }
    else {
      local_160 = puVar23 + lVar33;
      puVar42 = ssl->out_msg;
      lVar45 = 0;
      mbedtls_debug_print_msg
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                 ,0x26c,"client hello, adding alpn extension");
      for (ppcVar41 = ssl->conf->alpn_list; *ppcVar41 != (char *)0x0; ppcVar41 = ppcVar41 + 1) {
        sVar28 = strlen(*ppcVar41);
        lVar45 = lVar45 + (sVar28 & 0xff) + 1;
      }
      if ((puVar42 + 0x4000 < local_160) ||
         ((ulong)((long)(puVar42 + 0x4000) - (long)local_160) < lVar45 + 6U)) {
        lVar45 = 0;
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                   ,0x273,"buffer too small");
      }
      else {
        local_160[0] = '\0';
        local_160[1] = '\x10';
        puVar42 = local_160 + 6;
        for (ppcVar41 = ssl->conf->alpn_list; *ppcVar41 != (char *)0x0; ppcVar41 = ppcVar41 + 1) {
          sVar28 = strlen(*ppcVar41);
          *puVar42 = (uchar)sVar28;
          memcpy(puVar42 + 1,*ppcVar41,sVar28 & 0xff);
          puVar42 = puVar42 + (sVar28 & 0xff) + 1;
        }
        lVar45 = (long)puVar42 - (long)local_160;
        local_160[4] = (uchar)((uint)((int)lVar45 + 0xfffa) >> 8);
        local_160[5] = (char)lVar45 + 0xfa;
        local_160[2] = (uchar)((uint)((int)lVar45 + 0xfffc) >> 8);
        local_160[3] = (char)lVar45 + 0xfc;
      }
    }
    lVar45 = lVar45 + lVar33;
    if ((ssl->conf->field_0x176 & 1) == 0) {
      uStackY_1b0 = 0;
    }
    else {
      puVar42 = puVar23 + lVar45;
      puVar39 = ssl->out_msg;
      sVar28 = ssl->session_negotiate->ticket_len;
      mbedtls_debug_print_msg
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                 ,0x23f,"client hello, adding session ticket extension");
      if ((puVar39 + 0x4000 < puVar42) ||
         (uStackY_1b0 = sVar28 + 4, (ulong)((long)(puVar39 + 0x4000) - (long)puVar42) < uStackY_1b0)
         ) {
        uStackY_1b0 = 0;
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                   ,0x243,"buffer too small");
      }
      else {
        puVar42[0] = '\0';
        puVar42[1] = '#';
        puVar42[2] = (uchar)(sVar28 >> 8);
        puVar42[3] = (uchar)sVar28;
        if (sVar28 == 0 || ssl->session_negotiate->ticket == (uchar *)0x0) {
          uStackY_1b0 = 4;
        }
        else {
          mbedtls_debug_print_msg
                    (ssl,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                     ,0x254,"sending session ticket of length %d",sVar28);
          memcpy(puVar42 + 4,ssl->session_negotiate->ticket,sVar28);
        }
      }
    }
    puVar42 = local_158;
    mbedtls_debug_print_msg
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
               ,0x3ff,"client hello, total extension length: %d",uStackY_1b0 + lVar45);
    lVar45 = uStackY_1b0 + lVar45;
    if (lVar45 != 0) {
      *(ushort *)(puVar40 + 2) = (ushort)lVar45 << 8 | (ushort)lVar45 >> 8;
      puVar42 = puVar23 + lVar45;
    }
    ssl->out_msglen = (long)puVar42 - (long)local_150;
    ssl->out_msgtype = 0x16;
    *ssl->out_msg = '\x01';
    ssl->state = ssl->state + 1;
    if ((ssl->conf->field_0x174 & 2) != 0) {
      mbedtls_ssl_send_flight_completed(ssl);
    }
    iVar16 = mbedtls_ssl_write_record(ssl);
    if (iVar16 == 0) {
      pcVar35 = "<= write client hello";
      iVar16 = 0;
      iVar15 = 2;
      line = 0x419;
      goto LAB_00120bb2;
    }
    pcVar35 = "mbedtls_ssl_write_record";
    iVar15 = 0x415;
    goto LAB_00120771;
  case 2:
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
               ,0x582,"=> parse server hello");
    puVar40 = ssl->in_msg;
    iVar16 = mbedtls_ssl_read_record(ssl);
    if (iVar16 != 0) {
      mbedtls_debug_print_ret
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                 ,0x588,"mbedtls_ssl_read_record",iVar16);
      return iVar16;
    }
    if (ssl->in_msgtype != 0x16) {
      if (ssl->renego_status == 1) {
        iVar16 = ssl->renego_records_seen;
        ssl->renego_records_seen = iVar16 + 1;
        iVar15 = ssl->conf->renego_max_records;
        if (iVar16 < iVar15 || iVar15 < 0) {
          mbedtls_debug_print_msg
                    (ssl,1,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                     ,0x59b,"non-handshake message during renego");
          return -0x6b00;
        }
        pcVar35 = "renegotiation requested, but not honored by server";
        iVar16 = 1;
        iVar15 = 0x597;
      }
      else {
        pcVar35 = "bad server hello message";
        iVar16 = 1;
        iVar15 = 0x5a0;
      }
      goto LAB_00120c2b;
    }
    if ((ssl->conf->field_0x174 & 2) == 0) {
      lVar33 = 4;
    }
    else {
      if (*puVar40 == '\x03') {
        mbedtls_debug_print_msg
                  (ssl,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                   ,0x5a9,"received hello verify request");
        mbedtls_debug_print_msg
                  (ssl,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                   ,0x5aa,"<= parse server hello");
        puVar40 = ssl->in_msg;
        uVar18 = *(uint *)&ssl->conf->field_0x174 & 2;
        mbedtls_debug_print_msg
                  (ssl,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                   ,0x52e,"=> parse hello verify request");
        mbedtls_debug_print_buf
                  (ssl,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                   ,0x536,"server version",puVar40 + (ulong)uVar18 * 4 + 4,2);
        mbedtls_ssl_read_version
                  ((int *)&mbedtls_sha1,(int *)&mbedtls_md5,
                   *(uint *)&ssl->conf->field_0x174 >> 1 & 1,puVar40 + (ulong)uVar18 * 4 + 4);
        if (((1 < (int)mbedtls_md5.total[0] && 2 < (int)mbedtls_sha1.total[0]) &&
            (mbedtls_sha1.total[0] <= ssl->conf->max_major_ver)) &&
           (mbedtls_md5.total[0] <= ssl->conf->max_minor_ver)) {
          bVar12 = puVar40[(ulong)uVar18 * 4 + 6];
          puVar40 = puVar40 + (ulong)uVar18 * 4 + 7;
          uVar36 = (ulong)bVar12;
          mbedtls_debug_print_buf
                    (ssl,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                     ,0x54c,"cookie",puVar40,uVar36);
          if ((long)(ssl->in_msg + (ssl->in_msglen - (long)puVar40)) < (long)uVar36) {
            mbedtls_debug_print_msg
                      (ssl,1,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                       ,0x551,"cookie length does not match incoming message size");
            mbedtls_ssl_send_alert_message(ssl,'\x02','2');
            return -0x7980;
          }
          free(ssl->handshake->verify_cookie);
          puVar23 = (uchar *)calloc(1,uVar36);
          pmVar43 = ssl->handshake;
          pmVar43->verify_cookie = puVar23;
          if (puVar23 == (uchar *)0x0) {
            mbedtls_debug_print_msg
                      (ssl,1,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                       ,0x55c,"alloc failed (%d bytes)",uVar36);
            return -0x7f00;
          }
          memcpy(puVar23,puVar40,uVar36);
          pmVar43->verify_cookie_len = bVar12;
          ssl->state = 1;
          mbedtls_ssl_reset_checksum(ssl);
          mbedtls_ssl_recv_flight_completed(ssl);
          pcVar35 = "<= parse hello verify request";
          iVar16 = 0;
          iVar15 = 2;
          line = 0x569;
          goto LAB_00120bb2;
        }
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                   ,0x543,"bad server version");
        goto LAB_001209d0;
      }
      free(ssl->handshake->verify_cookie);
      pmVar43 = ssl->handshake;
      pmVar43->verify_cookie = (uchar *)0x0;
      pmVar43->verify_cookie_len = '\0';
      lVar33 = (ulong)((ssl->conf->field_0x174 & 2) >> 1) * 8 + 4;
    }
    if ((ssl->in_hslen < lVar33 + 0x26U) || (*puVar40 != '\x02')) {
      pcVar35 = "bad server hello message";
      iVar16 = 0x5ba;
      goto LAB_0011fa38;
    }
    puVar40 = puVar40 + lVar33;
    uVar50 = 0;
    mbedtls_debug_print_buf
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
               ,0x5cb,"server hello, version",puVar40,2);
    piVar5 = &ssl->minor_ver;
    mbedtls_ssl_read_version
              (&ssl->major_ver,piVar5,*(uint *)&ssl->conf->field_0x174 >> 1 & 1,puVar40);
    uVar18 = ssl->major_ver;
    pmVar4 = ssl->conf;
    if ((int)uVar18 < (int)(uint)pmVar4->min_major_ver) {
      uVar30 = (uint)pmVar4->min_minor_ver;
      uVar34 = *piVar5;
    }
    else {
      uVar34 = *piVar5;
      uVar30 = (uint)pmVar4->min_minor_ver;
      if ((((int)(uint)pmVar4->min_minor_ver <= (int)uVar34) && (uVar18 <= pmVar4->max_major_ver))
         && (uVar34 <= pmVar4->max_minor_ver)) {
        uVar18 = *(uint *)(puVar40 + 2);
        mbedtls_debug_print_msg
                  (ssl,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                   ,0x5e5,"server hello, current time: %lu",
                   (ulong)(uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 |
                          uVar18 << 0x18));
        pmVar43 = ssl->handshake;
        uVar49 = *(undefined8 *)(puVar40 + 2);
        uVar8 = *(undefined8 *)(puVar40 + 10);
        uVar9 = *(undefined8 *)(puVar40 + 0x1a);
        *(undefined8 *)(pmVar43->randbytes + 0x30) = *(undefined8 *)(puVar40 + 0x12);
        *(undefined8 *)(pmVar43->randbytes + 0x38) = uVar9;
        *(undefined8 *)(pmVar43->randbytes + 0x20) = uVar49;
        *(undefined8 *)(pmVar43->randbytes + 0x28) = uVar8;
        bVar12 = puVar40[0x22];
        uVar36 = (ulong)bVar12;
        mbedtls_debug_print_buf
                  (ssl,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                   ,0x5ec,"server hello, random bytes",puVar40 + 2,0x20);
        if (uVar36 < 0x21) {
          puVar23 = (uchar *)ssl->in_hslen;
          uVar37 = (ulong)((ssl->conf->field_0x174 & 2) >> 1);
          lVar33 = uVar37 * 8 + 4;
          if ((uchar *)(uVar37 * 8 + 0x2b + uVar36) < puVar23) {
            local_178 = (uchar *)(ulong)(ushort)(*(ushort *)(puVar40 + uVar36 + 0x26) << 8 |
                                                *(ushort *)(puVar40 + uVar36 + 0x26) >> 8);
            if ((local_178 + -1 < (uchar *)0x3) || (puVar23 != local_178 + lVar33 + uVar36 + 0x28))
            {
              pcVar35 = "bad server hello message";
              iVar16 = 0x5fc;
              goto LAB_0011fa38;
            }
          }
          else {
            if (puVar23 != (uchar *)(lVar33 + uVar36 + 0x26)) {
              pcVar35 = "bad server hello message";
              iVar16 = 0x606;
              goto LAB_0011fa38;
            }
            local_178 = (uchar *)0x0;
          }
          if (puVar40[uVar36 + 0x25] != '\0') {
            mbedtls_debug_print_msg
                      (ssl,1,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                       ,0x621,"server hello, bad compression: %d");
            return -0x7080;
          }
          uVar18 = (uint)(ushort)(*(ushort *)(puVar40 + uVar36 + 0x23) << 8 |
                                 *(ushort *)(puVar40 + uVar36 + 0x23) >> 8);
          pmVar25 = mbedtls_ssl_ciphersuite_from_id(uVar18);
          ssl->transform_negotiate->ciphersuite_info = pmVar25;
          if (pmVar25 == (mbedtls_ssl_ciphersuite_t *)0x0) {
            pcVar35 = "ciphersuite info for %04x not found";
            iVar16 = 0x62c;
            uVar36 = (ulong)uVar18;
            goto LAB_0011ebb5;
          }
          mbedtls_ssl_optimize_checksum(ssl,pmVar25);
          mbedtls_debug_print_msg
                    (ssl,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                     ,0x632,"server hello, session id len.: %d",uVar36);
          puVar23 = puVar40 + 0x23;
          mbedtls_debug_print_buf
                    (ssl,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                     ,0x633,"server hello, session id",puVar23,uVar36);
          pmVar43 = ssl->handshake;
          if (((((pmVar43->resume == 0) || (bVar12 == 0)) || (ssl->renego_status != 0)) ||
              ((pmVar7 = ssl->session_negotiate, pmVar7->ciphersuite != uVar18 ||
               (pmVar7->compression != 0)))) ||
             ((pmVar7->id_len != uVar36 || (iVar16 = bcmp(pmVar7->id,puVar23,uVar36), iVar16 != 0)))
             ) {
            ssl->state = ssl->state + 1;
            pmVar43->resume = 0;
            tVar26 = time((time_t *)0x0);
            pmVar7 = ssl->session_negotiate;
            pmVar7->start = tVar26;
            pmVar7->ciphersuite = uVar18;
            pmVar7->compression = 0;
            pmVar7->id_len = uVar36;
            memcpy(pmVar7->id,puVar23,uVar36);
          }
          else {
            ssl->state = 0xc;
            iVar16 = mbedtls_ssl_derive_keys(ssl);
            if (iVar16 != 0) {
              pcVar35 = "mbedtls_ssl_derive_keys";
              iVar15 = 0x651;
              goto LAB_00120771;
            }
          }
          pcVar35 = "a";
          if (ssl->handshake->resume == 0) {
            pcVar35 = "no";
          }
          mbedtls_debug_print_msg
                    (ssl,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                     ,0x657,"%s session has been resumed",pcVar35);
          mbedtls_debug_print_msg
                    (ssl,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                     ,0x659,"server hello, chosen ciphersuite: %04x",uVar18);
          mbedtls_debug_print_msg
                    (ssl,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                     ,0x65a,"server hello, compress alg.: %d",(ulong)puVar40[uVar36 + 0x25]);
          pmVar25 = mbedtls_ssl_ciphersuite_from_id(ssl->session_negotiate->ciphersuite);
          if ((pmVar25 == (mbedtls_ssl_ciphersuite_t *)0x0) ||
             (((ssl->conf->field_0x174 & 0x40) != 0 && (pmVar25->cipher == MBEDTLS_CIPHER_ARC4_128))
             )) {
            pcVar35 = "bad server hello message";
            iVar16 = 0x664;
          }
          else {
            mbedtls_debug_print_msg
                      (ssl,3,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                       ,0x668,"server hello, chosen ciphersuite: %s",pmVar25->name);
            piVar27 = ssl->conf->ciphersuite_list[ssl->minor_ver];
            do {
              iVar16 = *piVar27;
              if (iVar16 == 0) {
                pcVar35 = "bad server hello message";
                iVar16 = 0x66f;
                goto LAB_0011fa38;
              }
              piVar27 = piVar27 + 1;
            } while (iVar16 != ssl->session_negotiate->ciphersuite);
            ssl->session_negotiate->compression = 0;
            local_170 = (ushort *)(puVar40 + uVar36 + 0x28);
            mbedtls_debug_print_msg
                      (ssl,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                       ,0x687,"server hello, total extension length: %d",local_178);
            local_140 = ssl->own_verify_data;
            local_148 = ssl->peer_verify_data;
            local_160 = (uchar *)((ulong)local_160 & 0xffffffff00000000);
            do {
              if (local_178 == (uchar *)0x0) {
                iVar16 = ssl->secure_renegotiation;
                if ((iVar16 == 0) && ((*(uint *)&ssl->conf->field_0x174 & 0x30) == 0x20)) {
                  pcVar35 = "legacy renegotiation, breaking off handshake";
                  iVar16 = 0x720;
                  goto LAB_001220ab;
                }
                if (ssl->renego_status == 1) {
                  if (iVar16 == 1 && (int)local_160 == 0) {
                    pcVar35 = "renegotiation_info extension missing (secure)";
                    iVar16 = 0x728;
                    goto LAB_001220ab;
                  }
                  if (iVar16 == 0) {
                    if ((ssl->conf->field_0x174 & 0x30) == 0) {
                      pcVar35 = "legacy renegotiation not allowed";
                      iVar16 = 0x72f;
                      goto LAB_001220ab;
                    }
                    if ((int)local_160 == 1) {
                      pcVar35 = "renegotiation_info extension present (legacy)";
                      iVar16 = 0x736;
                      goto LAB_001220ab;
                    }
                  }
                }
                pcVar35 = "<= parse server hello";
                iVar16 = 0;
                iVar15 = 2;
                line = 0x743;
                goto LAB_00120bb2;
              }
              uVar13 = local_170[1] << 8 | local_170[1] >> 8;
              local_150 = (uchar *)(ulong)(uVar13 + 4);
              bVar48 = local_178 < local_150;
              local_178 = local_178 + -(long)local_150;
              if (bVar48) {
                pcVar35 = "bad server hello message";
                iVar16 = 0x692;
                goto LAB_0011fa38;
              }
              uVar14 = *local_170 << 8 | *local_170 >> 8;
              uVar36 = (ulong)uVar14;
              if (uVar14 == 1) {
                mbedtls_debug_print_msg
                          (ssl,3,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                           ,0x6a6,"found max_fragment_length extension");
                if (uVar13 != 1) {
                  return -0x7980;
                }
                uVar18 = *(uint *)&ssl->conf->field_0x174 >> 7 & 7;
                if (uVar18 == 0) {
                  return -0x7980;
                }
                if (uVar18 != (byte)local_170[2]) {
                  return -0x7980;
                }
              }
              else if (uVar14 == 4) {
                mbedtls_debug_print_msg
                          (ssl,3,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                           ,0x6b3,"found truncated_hmac extension");
                if (uVar13 != 0) {
                  return -0x7980;
                }
                if ((*(uint *)&ssl->conf->field_0x174 & 0x8000) == 0) {
                  return -0x7980;
                }
                ssl->session_negotiate->trunc_hmac = 1;
              }
              else if (uVar14 == 0xb) {
                mbedtls_debug_print_msg
                          (ssl,3,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                           ,0x6e8,"found supported_point_formats extension");
                if ((ushort)((byte)local_170[2] + 1) != uVar13) {
                  pcVar35 = "bad server hello message";
                  iVar16 = 0x4b8;
                  goto LAB_0011fa38;
                }
                uVar36 = 0;
                do {
                  uVar37 = uVar36;
                  if ((byte)local_170[2] == uVar37) {
                    pcVar35 = "no point format in common";
                    iVar16 = 0x4d0;
                    goto LAB_0011fa38;
                  }
                  uVar18 = (uint)*(byte *)((long)local_170 + uVar37 + 5);
                  uVar36 = uVar37 + 1;
                } while (1 < uVar18);
                (ssl->handshake->ecdh_ctx).point_format = uVar18;
                uVar36 = (ulong)*(byte *)((long)local_170 + uVar37 + 5);
                iVar16 = 4;
                iVar15 = 0x4c8;
                pcVar35 = "point format selected: %d";
LAB_00121df3:
                mbedtls_debug_print_msg
                          (ssl,iVar16,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                           ,iVar15,pcVar35,uVar36);
              }
              else {
                uVar18 = (uint)uVar13;
                iVar16 = 3;
                if (uVar14 == 0x10) {
                  mbedtls_debug_print_msg
                            (ssl,3,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                             ,0x703,"found alpn extension");
                  if (uVar18 < 4) {
                    return -0x7980;
                  }
                  ppcVar41 = ssl->conf->alpn_list;
                  if (ppcVar41 == (char **)0x0) {
                    return -0x7980;
                  }
                  uVar36 = (ulong)(ushort)(local_170[2] << 8 | local_170[2] >> 8);
                  if (uVar36 != (ulong)uVar18 - 2) {
                    return -0x7980;
                  }
                  uVar37 = (ulong)(byte)local_170[3];
                  if (uVar36 - 1 != uVar37) {
                    return -0x7980;
                  }
                  local_158 = (uchar *)((long)local_170 + 7);
                  while( true ) {
                    pcVar35 = *ppcVar41;
                    if (pcVar35 == (char *)0x0) {
                      return -0x7980;
                    }
                    sVar28 = strlen(pcVar35);
                    if ((sVar28 == uVar37) && (iVar16 = bcmp(local_158,pcVar35,uVar37), iVar16 == 0)
                       ) break;
                    ppcVar41 = ppcVar41 + 1;
                  }
                  ssl->alpn_chosen = pcVar35;
                }
                else if (uVar14 == 0x16) {
                  mbedtls_debug_print_msg
                            (ssl,3,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                             ,0x6c0,"found encrypt_then_mac extension");
                  if ((ssl->conf->field_0x175 & 4) == 0) {
                    return -0x7980;
                  }
                  if (uVar13 != 0) {
                    return -0x7980;
                  }
                  if (*piVar5 == 0) {
                    return -0x7980;
                  }
                  ssl->session_negotiate->encrypt_then_mac = 1;
                }
                else if (uVar14 == 0x17) {
                  mbedtls_debug_print_msg
                            (ssl,3,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                             ,0x6cd,"found extended_master_secret extension");
                  if ((ssl->conf->field_0x175 & 8) == 0) {
                    return -0x7980;
                  }
                  if (uVar13 != 0) {
                    return -0x7980;
                  }
                  if (*piVar5 == 0) {
                    return -0x7980;
                  }
                  ssl->handshake->extended_ms = 1;
                }
                else if (uVar14 == 0x23) {
                  mbedtls_debug_print_msg
                            (ssl,3,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                             ,0x6da,"found session_ticket extension");
                  if (uVar13 != 0) {
                    return -0x7980;
                  }
                  if ((*(uint *)&ssl->conf->field_0x174 & 0x10000) == 0) {
                    return -0x7980;
                  }
                  ssl->handshake->new_session_ticket = 1;
                }
                else {
                  if (uVar14 != 0xff01) {
                    iVar15 = 0x70d;
                    pcVar35 = "unknown extension found: %d (ignoring)";
                    goto LAB_00121df3;
                  }
                  mbedtls_debug_print_msg
                            (ssl,3,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                             ,0x699,"found renegotiation extension");
                  if (ssl->renego_status != 0) {
                    sVar19 = ssl->verify_data_len;
                    if ((sVar19 * 2 + 1 == (ulong)uVar18) &&
                       (sVar19 * 2 == (ulong)(byte)local_170[2])) {
                      iVar16 = mbedtls_ssl_safer_memcmp
                                         ((void *)((long)local_170 + 5),local_140,sVar19);
                      if (iVar16 == 0) {
                        iVar16 = mbedtls_ssl_safer_memcmp
                                           ((void *)((long)local_170 + 5 + sVar19),local_148,sVar19)
                        ;
                        local_160 = (uchar *)CONCAT44(local_160._4_4_,1);
                        if (iVar16 == 0) goto LAB_00121e88;
                      }
                    }
                    pcVar35 = "non-matching renegotiation info";
                    iVar16 = 0x42f;
LAB_001220ab:
                    mbedtls_debug_print_msg
                              (ssl,1,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                               ,iVar16,pcVar35);
                    iVar16 = mbedtls_ssl_send_fatal_handshake_failure(ssl);
                    if (iVar16 != 0) {
                      return iVar16;
                    }
                    return -0x7980;
                  }
                  if ((uVar13 != 1) || ((char)local_170[2] != '\0')) {
                    pcVar35 = "non-zero length renegotiation info";
                    iVar16 = 0x43c;
                    goto LAB_001220ab;
                  }
                  ssl->secure_renegotiation = 1;
                  local_160 = (uchar *)CONCAT44(local_160._4_4_,1);
                }
              }
LAB_00121e88:
              local_170 = (ushort *)((long)local_170 + (long)local_150);
            } while ((uchar *)0x2 < local_178 + -1);
            pcVar35 = "bad server hello message";
            iVar16 = 0x715;
          }
        }
        else {
          pcVar35 = "bad server hello message";
          iVar16 = 0x5f0;
        }
LAB_0011fa38:
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                   ,iVar16,pcVar35);
        return -0x7980;
      }
    }
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
               ,0x5d8,"server version out of bounds -  min: [%d:%d], server: [%d:%d], max: [%d:%d]",
               (ulong)pmVar4->min_major_ver,CONCAT44(uVar50,uVar30),CONCAT44(uVar51,uVar18),uVar34,
               (uint)pmVar4->max_major_ver,(uint)pmVar4->max_minor_ver);
LAB_001209d0:
    mbedtls_ssl_send_alert_message(ssl,'\x02','F');
    return -0x6e80;
  case 3:
    iVar16 = mbedtls_ssl_parse_certificate(ssl);
    return iVar16;
  case 4:
    pmVar25 = ssl->transform_negotiate->ciphersuite_info;
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
               ,0x896,"=> parse server key exchange");
    if (pmVar25->key_exchange - MBEDTLS_KEY_EXCHANGE_ECDH_RSA < 2) {
      pmVar3 = ssl->session_negotiate->peer_cert;
      if (pmVar3 == (mbedtls_x509_crt *)0x0) {
        mbedtls_debug_print_msg
                  (ssl,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                   ,0x871,"certificate required");
        iVar16 = -0x7700;
      }
      else {
        iVar16 = mbedtls_pk_can_do(&pmVar3->pk,MBEDTLS_PK_ECKEY);
        if (iVar16 == 0) {
          mbedtls_debug_print_msg
                    (ssl,1,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                     ,0x878,"server key not ECDH capable");
          iVar16 = -0x6d00;
        }
        else {
          iVar16 = mbedtls_ecdh_get_params
                             (&ssl->handshake->ecdh_ctx,
                              (mbedtls_ecp_keypair *)(ssl->session_negotiate->peer_cert->pk).pk_ctx,
                              MBEDTLS_ECDH_THEIRS);
          if (iVar16 == 0) {
            iVar16 = ssl_check_server_ecdh_params(ssl);
            if (iVar16 == 0) {
              pcVar35 = "<= skip parse server key exchange";
              iVar16 = 0x8ae;
              goto LAB_0011efc4;
            }
            mbedtls_debug_print_msg
                      (ssl,1,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                       ,0x887,"bad server certificate (ECDH curve)");
            iVar16 = -0x7a00;
          }
          else {
            mbedtls_debug_print_ret
                      (ssl,1,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                       ,0x881,"mbedtls_ecdh_get_params",iVar16);
          }
        }
      }
      pcVar35 = "ssl_get_ecdh_params_from_cert";
      iVar15 = 0x8aa;
      goto LAB_00120771;
    }
    if (pmVar25->key_exchange == MBEDTLS_KEY_EXCHANGE_RSA) {
      pcVar35 = "<= skip parse server key exchange";
      iVar16 = 0x89b;
      goto LAB_0011efc4;
    }
    iVar16 = mbedtls_ssl_read_record(ssl);
    if (iVar16 != 0) {
      pcVar35 = "mbedtls_ssl_read_record";
      iVar15 = 0x8b9;
      goto LAB_00120771;
    }
    if (ssl->in_msgtype != 0x16) {
      pcVar35 = "bad server key exchange message";
      iVar16 = 1;
      iVar15 = 0x8bf;
      goto LAB_00120c2b;
    }
    puVar40 = ssl->in_msg;
    if (*puVar40 != '\f') {
      if ((pmVar25->key_exchange | MBEDTLS_KEY_EXCHANGE_DHE_RSA) != MBEDTLS_KEY_EXCHANGE_RSA_PSK) {
        pcVar35 = "bad server key exchange message";
        iVar16 = 1;
        iVar15 = 0x8d0;
        goto LAB_00120c2b;
      }
      ssl->record_read = 1;
LAB_001208d6:
      ssl->state = ssl->state + 1;
      pcVar35 = "<= parse server key exchange";
      iVar16 = 0;
      iVar15 = 2;
      line = 0x9d4;
      goto LAB_00120bb2;
    }
    uVar36 = (ulong)(*(uint *)&ssl->conf->field_0x174 & 2);
    puVar44 = (ushort *)(puVar40 + uVar36 * 4 + 4);
    end = (ushort *)(puVar40 + ssl->in_hslen);
    sVar19 = ssl->in_hslen - (uVar36 * 4 + 4);
    local_168 = puVar44;
    mbedtls_debug_print_buf
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
               ,0x8d6,"server key exchange",(uchar *)puVar44,sVar19);
    uVar51 = (undefined4)(sVar19 >> 0x20);
    mVar1 = pmVar25->key_exchange;
    puVar29 = local_168;
    if ((mVar1 - MBEDTLS_KEY_EXCHANGE_PSK < 4) &&
       (puVar29 = (ushort *)((long)puVar44 + (ulong)(ushort)(*puVar44 << 8 | *puVar44 >> 8) + 2),
       end < puVar29)) {
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                 ,0x7ca,"bad server key exchange message (psk_identity_hint length)");
      iVar16 = 0x8e0;
      goto LAB_00121548;
    }
    local_168 = puVar29;
    if (MBEDTLS_KEY_EXCHANGE_ECDHE_PSK < mVar1) {
LAB_001210fb:
      iVar16 = 0x91b;
LAB_0011f5ca:
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                 ,iVar16,"should never happen");
      return -0x6c00;
    }
    if ((0x118U >> (mVar1 & 0x1f) & 1) != 0) {
      iVar16 = mbedtls_ecdh_read_params(&ssl->handshake->ecdh_ctx,(uchar **)&local_168,(uchar *)end)
      ;
      if (iVar16 == 0) {
        iVar16 = ssl_check_server_ecdh_params(ssl);
        if (iVar16 == 0) goto LAB_00120d3c;
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                   ,0x7ad,"bad server key exchange message (ECDHE curve)");
      }
      else {
        mbedtls_debug_print_ret
                  (ssl,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                   ,0x7a7,"mbedtls_ecdh_read_params",iVar16);
      }
      iVar16 = 0x905;
      goto LAB_00121548;
    }
    if ((0x44U >> (mVar1 & 0x1f) & 1) != 0) {
      iVar16 = mbedtls_dhm_read_params(&ssl->handshake->dhm_ctx,(uchar **)&local_168,(uchar *)end);
      if (iVar16 == 0) {
        uVar36 = (ssl->handshake->dhm_ctx).len << 3;
        uVar18 = ssl->conf->dhm_min_bitlen;
        if (uVar18 <= uVar36) {
          mbedtls_debug_print_mpi
                    (ssl,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                     ,0x766,"DHM: P ",&(ssl->handshake->dhm_ctx).P);
          mbedtls_debug_print_mpi
                    (ssl,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                     ,0x767,"DHM: G ",&(ssl->handshake->dhm_ctx).G);
          mbedtls_debug_print_mpi
                    (ssl,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                     ,0x768,"DHM: GY",&(ssl->handshake->dhm_ctx).GY);
          goto LAB_00120d3c;
        }
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                   ,0x762,"DHM prime too short: %d < %d",uVar36,CONCAT44(uVar51,uVar18));
      }
      else {
        mbedtls_debug_print_ret
                  (ssl,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                   ,0x75a,"mbedtls_dhm_read_params",iVar16);
      }
      iVar16 = 0x8f5;
      goto LAB_00121548;
    }
    if ((0xa0U >> (mVar1 & 0x1f) & 1) == 0) goto LAB_001210fb;
LAB_00120d3c:
    puVar29 = local_168;
    if (2 < pmVar25->key_exchange - MBEDTLS_KEY_EXCHANGE_DHE_RSA) goto LAB_001208d6;
    puVar40 = ssl->in_msg;
    bVar12 = ssl->conf->field_0x174;
    if (ssl->minor_ver != 3) {
      if (2 < ssl->minor_ver) {
        iVar16 = 0x94f;
        goto LAB_0011f5ca;
      }
      type = mbedtls_ssl_get_ciphersuite_sig_pk_alg(pmVar25);
      mVar32 = (uint)(type == MBEDTLS_PK_ECDSA) << 2;
LAB_0012125f:
      uVar36 = (ulong)(ushort)(*local_168 << 8 | *local_168 >> 8);
      puVar44 = local_168 + 1;
      if (end != (ushort *)((long)local_168 + uVar36 + 2)) {
        iVar16 = 0x95b;
        local_168 = puVar44;
        goto LAB_00121548;
      }
      puVar40 = puVar40 + (ulong)((bVar12 & 2) >> 1) * 8 + 4;
      sVar19 = (long)puVar29 - (long)puVar40;
      local_168 = puVar44;
      mbedtls_debug_print_buf
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                 ,0x95f,"signature",(uchar *)puVar44,uVar36);
      if (mVar32 == MBEDTLS_MD_NONE) {
        mbedtls_md5_init(&mbedtls_md5);
        mbedtls_sha1_init(&mbedtls_sha1);
        mbedtls_md5_starts(&mbedtls_md5);
        mbedtls_md5_update(&mbedtls_md5,ssl->handshake->randbytes,0x40);
        mbedtls_md5_update(&mbedtls_md5,puVar40,sVar19);
        mbedtls_md5_finish(&mbedtls_md5,hash);
        mbedtls_sha1_starts(&mbedtls_sha1);
        mbedtls_sha1_update(&mbedtls_sha1,ssl->handshake->randbytes,0x40);
        mbedtls_sha1_update(&mbedtls_sha1,puVar40,sVar19);
        mbedtls_sha1_finish(&mbedtls_sha1,hash + 0x10);
        mbedtls_md5_free(&mbedtls_md5);
        mbedtls_sha1_free(&mbedtls_sha1);
        sVar19 = 0x24;
        sVar31 = sVar19;
      }
      else {
        mbedtls_md_init((mbedtls_md_context_t *)&mbedtls_sha1);
        pmVar24 = mbedtls_md_info_from_type(mVar32);
        iVar16 = mbedtls_md_setup((mbedtls_md_context_t *)&mbedtls_sha1,pmVar24,0);
        if (iVar16 != 0) {
          pcVar35 = "mbedtls_md_setup";
          iVar15 = 0x9a2;
          goto LAB_00120771;
        }
        mbedtls_md_starts((mbedtls_md_context_t *)&mbedtls_sha1);
        mbedtls_md_update((mbedtls_md_context_t *)&mbedtls_sha1,ssl->handshake->randbytes,0x40);
        mbedtls_md_update((mbedtls_md_context_t *)&mbedtls_sha1,puVar40,sVar19);
        mbedtls_md_finish((mbedtls_md_context_t *)&mbedtls_sha1,hash);
        mbedtls_md_free((mbedtls_md_context_t *)&mbedtls_sha1);
        pmVar24 = mbedtls_md_info_from_type(mVar32);
        bVar12 = mbedtls_md_get_size(pmVar24);
        sVar19 = (size_t)bVar12;
        sVar31 = 0;
      }
      mbedtls_debug_print_buf
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                 ,0x9b5,"parameters hash",hash,sVar19);
      pmVar3 = ssl->session_negotiate->peer_cert;
      if (pmVar3 == (mbedtls_x509_crt *)0x0) {
        pcVar35 = "certificate required";
        iVar16 = 2;
        iVar15 = 0x9b9;
        goto LAB_00120c2b;
      }
      iVar16 = mbedtls_pk_can_do(&pmVar3->pk,type);
      if (iVar16 == 0) {
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                   ,0x9c2,"bad server key exchange message");
        return -0x6d00;
      }
      iVar16 = mbedtls_pk_verify(&ssl->session_negotiate->peer_cert->pk,mVar32,hash,sVar31,
                                 (uchar *)local_168,uVar36);
      if (iVar16 != 0) {
        pcVar35 = "mbedtls_pk_verify";
        iVar15 = 0x9c9;
        goto LAB_00120771;
      }
      goto LAB_001208d6;
    }
    if (local_168 + 1 <= end) {
      mVar32 = mbedtls_ssl_md_alg_from_hash((byte)*local_168);
      if (mVar32 == MBEDTLS_MD_NONE) {
        bVar12 = (byte)*local_168;
        pcVar35 = "Server used unsupported HashAlgorithm %d";
        iVar16 = 0x845;
      }
      else {
        type = mbedtls_ssl_pk_alg_from_sig(*(byte *)((long)local_168 + 1));
        if (type != MBEDTLS_PK_NONE) {
          iVar16 = mbedtls_ssl_check_sig_hash(ssl,mVar32);
          if (iVar16 == 0) {
            mbedtls_debug_print_msg
                      (ssl,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                       ,0x85d,"Server used SignatureAlgorithm %d",
                       (ulong)*(byte *)((long)local_168 + 1));
            mbedtls_debug_print_msg
                      (ssl,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                       ,0x85e,"Server used HashAlgorithm %d",(ulong)(byte)*local_168);
            local_168 = local_168 + 1;
            mVar17 = mbedtls_ssl_get_ciphersuite_sig_pk_alg(pmVar25);
            if (type != mVar17) {
              iVar16 = 0x93c;
              goto LAB_00121548;
            }
            goto LAB_0012125f;
          }
          mbedtls_debug_print_msg
                    (ssl,1,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                     ,0x859,"server used HashAlgorithm that was not offered");
          goto LAB_0012152f;
        }
        bVar12 = *(byte *)((long)local_168 + 1);
        pcVar35 = "server used unsupported SignatureAlgorithm %d";
        iVar16 = 0x84f;
      }
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                 ,iVar16,pcVar35,(ulong)bVar12);
    }
LAB_0012152f:
    iVar16 = 0x936;
LAB_00121548:
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
               ,iVar16,"bad server key exchange message");
    return -0x7b00;
  case 5:
    pmVar25 = ssl->transform_negotiate->ciphersuite_info;
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
               ,0x9fc,"=> parse certificate request");
    mVar1 = pmVar25->key_exchange;
    if ((mVar1 < (MBEDTLS_KEY_EXCHANGE_ECDHE_PSK|MBEDTLS_KEY_EXCHANGE_ECDHE_ECDSA)) &&
       ((0x9e0U >> (mVar1 & 0x1f) & 1) != 0)) {
      pcVar35 = "<= skip parse certificate request";
      iVar16 = 0xa04;
      goto LAB_0011efc4;
    }
    if (ssl->record_read == 0) {
      iVar16 = mbedtls_ssl_read_record(ssl);
      if (iVar16 != 0) {
        pcVar35 = "mbedtls_ssl_read_record";
        iVar15 = 0xa0d;
        goto LAB_00120771;
      }
      if (ssl->in_msgtype != 0x16) {
        pcVar35 = "bad certificate request message";
        iVar16 = 1;
        iVar15 = 0xa13;
        goto LAB_00120c2b;
      }
      ssl->record_read = 1;
    }
    ssl->client_auth = 0;
    ssl->state = ssl->state + 1;
    if (*ssl->in_msg == '\r') {
      ssl->client_auth = 1;
      pcVar35 = "a";
    }
    else {
      pcVar35 = "no";
    }
    iVar16 = 0;
    mbedtls_debug_print_msg
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
               ,0xa21,"got %s certificate request",pcVar35);
    if (ssl->client_auth != 0) {
      ssl->record_read = 0;
      puVar40 = ssl->in_msg;
      uVar47 = (ulong)((ssl->conf->field_0x174 & 2) >> 1);
      uVar37 = (ulong)puVar40[uVar47 * 8 + 4];
      uVar36 = ssl->in_hslen;
      if (uVar36 < uVar37 + uVar47 * 8 + 6) {
        iVar16 = 0xa48;
LAB_00120bd7:
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                   ,iVar16,"bad certificate request message");
        return -0x7a80;
      }
      lVar33 = uVar47 * 8 + 4;
      if (ssl->minor_ver == 3) {
        uVar36 = (ulong)(((*(ushort *)(puVar40 + uVar37 + uVar47 * 8 + 5) & 0xff00) << 8 |
                         (uint)*(ushort *)(puVar40 + uVar37 + uVar47 * 8 + 5) << 0x18) >> 0x10);
        for (uVar47 = 0; uVar47 < uVar36; uVar47 = uVar47 + 2) {
          in_stack_fffffffffffffe58 =
               CONCAT44((int)((ulong)in_stack_fffffffffffffe58 >> 0x20),
                        (uint)puVar40[uVar47 + lVar33 + uVar37 + 4]);
          mbedtls_debug_print_msg
                    (ssl,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                     ,0xa58,"Supported Signature Algorithm found: %d,%d",
                     (ulong)puVar40[uVar47 + lVar33 + uVar37 + 3],in_stack_fffffffffffffe58);
        }
        uVar37 = uVar36 + uVar37 + 2;
        uVar36 = ssl->in_hslen;
        uVar47 = (ulong)(*(uint *)&ssl->conf->field_0x174 & 2);
        if (uVar36 < uVar47 * 4 + 6 + uVar37) {
          iVar16 = 0xa60;
          goto LAB_00120bd7;
        }
        lVar33 = uVar47 * 4 + 4;
      }
      if (uVar36 != (ulong)(ushort)(*(ushort *)(puVar40 + uVar37 + 1 + lVar33) << 8 |
                                   *(ushort *)(puVar40 + uVar37 + 1 + lVar33) >> 8) +
                    uVar37 + lVar33 + 3) {
        iVar16 = 0xa6d;
        goto LAB_00120bd7;
      }
    }
    pcVar35 = "<= parse certificate request";
    iVar15 = 2;
    line = 0xa72;
    goto LAB_00120bb2;
  case 6:
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
               ,0xa81,"=> parse server hello done");
    if (ssl->record_read == 0) {
      iVar16 = mbedtls_ssl_read_record(ssl);
      if (iVar16 != 0) {
        pcVar35 = "mbedtls_ssl_read_record";
        iVar15 = 0xa87;
        goto LAB_00120771;
      }
      if (ssl->in_msgtype != 0x16) {
        pcVar35 = "bad server hello done message";
        iVar16 = 1;
        iVar15 = 0xa8d;
        goto LAB_00120c2b;
      }
    }
    ssl->record_read = 0;
    if ((ssl->in_hslen != (ulong)((ssl->conf->field_0x174 & 2) >> 1) * 8 + 4) ||
       (*ssl->in_msg != '\x0e')) {
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                 ,0xa96,"bad server hello done message");
      return -0x7b80;
    }
    ssl->state = ssl->state + 1;
    if ((ssl->conf->field_0x174 & 2) != 0) {
      mbedtls_ssl_recv_flight_completed(ssl);
    }
    pcVar35 = "<= parse server hello done";
    iVar16 = 0;
    iVar15 = 2;
    line = 0xaa1;
    goto LAB_00120bb2;
  case 7:
    iVar16 = mbedtls_ssl_write_certificate(ssl);
    return iVar16;
  case 8:
    pmVar25 = ssl->transform_negotiate->ciphersuite_info;
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
               ,0xaac,"=> write client key exchange");
    switch(pmVar25->key_exchange) {
    case MBEDTLS_KEY_EXCHANGE_RSA:
      uStackY_1b0 = 4;
      iVar16 = ssl_write_encrypted_pms(ssl,4,(size_t *)&mbedtls_sha1,0);
      if (iVar16 != 0) {
        return iVar16;
      }
      break;
    case MBEDTLS_KEY_EXCHANGE_DHE_RSA:
      mbedtls_sha1.total = (uint32_t  [2])(ssl->handshake->dhm_ctx).len;
      ssl->out_msg[4] = mbedtls_sha1.total[0]._1_1_;
      ssl->out_msg[5] = (uchar)mbedtls_sha1.total[0];
      pmVar43 = ssl->handshake;
      sVar19 = mbedtls_mpi_size(&(pmVar43->dhm_ctx).P);
      iVar16 = mbedtls_dhm_make_public
                         (&pmVar43->dhm_ctx,(int)sVar19,ssl->out_msg + 6,(size_t)mbedtls_sha1.total,
                          (_func_int_void_ptr_uchar_ptr_size_t *)ssl->conf->f_rng,ssl->conf->p_rng);
      if (iVar16 != 0) {
        pcVar35 = "mbedtls_dhm_make_public";
        iVar15 = 0xac0;
        goto LAB_00120771;
      }
      mbedtls_debug_print_mpi
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                 ,0xac4,"DHM: X ",&(ssl->handshake->dhm_ctx).X);
      mbedtls_debug_print_mpi
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                 ,0xac5,"DHM: GX",&(ssl->handshake->dhm_ctx).GX);
      pmVar43 = ssl->handshake;
      iVar16 = mbedtls_dhm_calc_secret
                         (&pmVar43->dhm_ctx,pmVar43->premaster,0x424,&pmVar43->pmslen,
                          (_func_int_void_ptr_uchar_ptr_size_t *)ssl->conf->f_rng,ssl->conf->p_rng);
      if (iVar16 != 0) {
        pcVar35 = "mbedtls_dhm_calc_secret";
        iVar15 = 0xacd;
        goto LAB_00120771;
      }
      uStackY_1b0 = 6;
      X = &(ssl->handshake->dhm_ctx).K;
      pcVar35 = "DHM: K ";
      iVar16 = 0xad1;
      goto LAB_0011f8c9;
    case MBEDTLS_KEY_EXCHANGE_ECDHE_RSA:
    case MBEDTLS_KEY_EXCHANGE_ECDHE_ECDSA:
    case MBEDTLS_KEY_EXCHANGE_ECDH_RSA:
    case MBEDTLS_KEY_EXCHANGE_ECDH_ECDSA:
      iVar16 = mbedtls_ecdh_make_public
                         (&ssl->handshake->ecdh_ctx,(size_t *)&mbedtls_sha1,ssl->out_msg + 4,1000,
                          (_func_int_void_ptr_uchar_ptr_size_t *)ssl->conf->f_rng,ssl->conf->p_rng);
      if (iVar16 != 0) {
        pcVar35 = "mbedtls_ecdh_make_public";
        iVar15 = 0xae9;
        goto LAB_00120771;
      }
      mbedtls_debug_print_ecp
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                 ,0xaed,"ECDH: Q",&(ssl->handshake->ecdh_ctx).Q);
      pmVar43 = ssl->handshake;
      iVar16 = mbedtls_ecdh_calc_secret
                         (&pmVar43->ecdh_ctx,&pmVar43->pmslen,pmVar43->premaster,0x400,
                          (_func_int_void_ptr_uchar_ptr_size_t *)ssl->conf->f_rng,ssl->conf->p_rng);
      if (iVar16 != 0) {
        pcVar35 = "mbedtls_ecdh_calc_secret";
        iVar15 = 0xaf5;
        goto LAB_00120771;
      }
      uStackY_1b0 = 4;
      X = &(ssl->handshake->ecdh_ctx).z;
      pcVar35 = "ECDH: z";
      iVar16 = 0xaf9;
LAB_0011f8c9:
      mbedtls_debug_print_mpi
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                 ,iVar16,pcVar35,X);
      break;
    case MBEDTLS_KEY_EXCHANGE_PSK:
    case MBEDTLS_KEY_EXCHANGE_DHE_PSK:
    case MBEDTLS_KEY_EXCHANGE_RSA_PSK:
    case MBEDTLS_KEY_EXCHANGE_ECDHE_PSK:
      pmVar4 = ssl->conf;
      if ((pmVar4->psk == (uchar *)0x0) || (pmVar4->psk_identity == (uchar *)0x0)) {
        pcVar35 = "got no private key for PSK";
        iVar16 = 0xb0b;
LAB_0011f0c1:
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                   ,iVar16,pcVar35);
        return -0x7600;
      }
      mbedtls_sha1.total = (uint32_t  [2])pmVar4->psk_identity_len;
      if ((long)mbedtls_sha1.total - 0x3ffbU < 0xffffffffffffbfff) {
        pcVar35 = "psk identity too long or SSL buffer too short";
        iVar16 = 0xb15;
LAB_0011f02b:
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                   ,iVar16,pcVar35);
        return -0x6a00;
      }
      ssl->out_msg[4] = mbedtls_sha1.total[0]._1_1_;
      ssl->out_msg[5] = (uchar)mbedtls_sha1.total[0];
      memcpy(ssl->out_msg + 6,ssl->conf->psk_identity,ssl->conf->psk_identity_len);
      if (3 < pmVar25->key_exchange - MBEDTLS_KEY_EXCHANGE_PSK) {
        iVar16 = 0xb60;
        goto LAB_0011f5ca;
      }
      pmVar4 = ssl->conf;
      sVar19 = pmVar4->psk_identity_len;
      uStackY_1b0 = sVar19 + 6;
      switch(pmVar25->key_exchange) {
      case MBEDTLS_KEY_EXCHANGE_PSK:
        mbedtls_sha1.total[0] = 0;
        mbedtls_sha1.total[1] = 0;
        break;
      case MBEDTLS_KEY_EXCHANGE_DHE_PSK:
        mbedtls_sha1.total = (uint32_t  [2])(ssl->handshake->dhm_ctx).len;
        if (0x4000 < (long)mbedtls_sha1.total + sVar19 + 8) {
          pcVar35 = "psk identity or DHM size too long or SSL buffer too short";
          iVar16 = 0xb39;
          goto LAB_0011f02b;
        }
        uStackY_1b0 = sVar19 + 8;
        ssl->out_msg[sVar19 + 6] = mbedtls_sha1.total[0]._1_1_;
        ssl->out_msg[sVar19 + 7] = (uchar)mbedtls_sha1.total[0];
        pmVar43 = ssl->handshake;
        sVar19 = mbedtls_mpi_size(&(pmVar43->dhm_ctx).P);
        iVar16 = mbedtls_dhm_make_public
                           (&pmVar43->dhm_ctx,(int)sVar19,ssl->out_msg + uStackY_1b0,
                            (size_t)mbedtls_sha1.total,
                            (_func_int_void_ptr_uchar_ptr_size_t *)ssl->conf->f_rng,ssl->conf->p_rng
                           );
        if (iVar16 != 0) {
          pcVar35 = "mbedtls_dhm_make_public";
          iVar15 = 0xb46;
          goto LAB_00120771;
        }
        break;
      case MBEDTLS_KEY_EXCHANGE_RSA_PSK:
        iVar16 = ssl_write_encrypted_pms(ssl,uStackY_1b0,(size_t *)&mbedtls_sha1,2);
        if (iVar16 != 0) {
          return iVar16;
        }
        break;
      case MBEDTLS_KEY_EXCHANGE_ECDHE_PSK:
        iVar16 = mbedtls_ecdh_make_public
                           (&ssl->handshake->ecdh_ctx,(size_t *)&mbedtls_sha1,
                            ssl->out_msg + uStackY_1b0,0x3ffa - sVar19,
                            (_func_int_void_ptr_uchar_ptr_size_t *)pmVar4->f_rng,pmVar4->p_rng);
        if (iVar16 != 0) {
          pcVar35 = "mbedtls_ecdh_make_public";
          iVar15 = 0xb57;
          goto LAB_00120771;
        }
        mbedtls_debug_print_ecp
                  (ssl,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                   ,0xb5b,"ECDH: Q",&(ssl->handshake->ecdh_ctx).Q);
      }
      iVar16 = mbedtls_ssl_psk_derive_premaster(ssl,pmVar25->key_exchange);
      if (iVar16 != 0) {
        pcVar35 = "mbedtls_ssl_psk_derive_premaster";
        iVar15 = 0xb67;
        goto LAB_00120771;
      }
      break;
    default:
      iVar16 = 0xb91;
      goto LAB_0011f5ca;
    }
    ssl->out_msglen = uStackY_1b0 + (long)mbedtls_sha1.total;
    ssl->out_msgtype = 0x16;
    *ssl->out_msg = '\x10';
    ssl->state = ssl->state + 1;
    iVar16 = mbedtls_ssl_write_record(ssl);
    if (iVar16 == 0) {
      pcVar35 = "<= write client key exchange";
      iVar16 = 0;
      iVar15 = 2;
      line = 0xba1;
      goto LAB_00120bb2;
    }
    pcVar35 = "mbedtls_ssl_write_record";
    iVar15 = 0xb9d;
    goto LAB_00120771;
  case 9:
    pmVar25 = ssl->transform_negotiate->ciphersuite_info;
    mbedtls_md5.total[0] = 0;
    mbedtls_md5.total[1] = 0;
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
               ,0xbd2,"=> write certificate verify");
    iVar16 = mbedtls_ssl_derive_keys(ssl);
    if (iVar16 == 0) {
      mVar1 = pmVar25->key_exchange;
      if ((mVar1 < (MBEDTLS_KEY_EXCHANGE_ECDHE_PSK|MBEDTLS_KEY_EXCHANGE_ECDHE_ECDSA)) &&
         ((0x9e0U >> (mVar1 & 0x1f) & 1) != 0)) {
        pcVar35 = "<= skip write certificate verify";
        iVar16 = 0xbe0;
      }
      else {
        if ((ssl->client_auth != 0) &&
           ((((pmVar43 = ssl->handshake, pmVar43 != (mbedtls_ssl_handshake_params *)0x0 &&
              (pmVar20 = pmVar43->key_cert, pmVar20 != (mbedtls_ssl_key_cert *)0x0)) ||
             (pmVar20 = ssl->conf->key_cert, pmVar20 != (mbedtls_ssl_key_cert *)0x0)) &&
            (pmVar20->cert != (mbedtls_x509_crt *)0x0)))) {
          pmVar21 = mbedtls_ssl_own_key(ssl);
          if (pmVar21 == (mbedtls_pk_context *)0x0) {
            pcVar35 = "got no private key for certificate";
            iVar16 = 0xbee;
            goto LAB_0011f0c1;
          }
          hash_00 = &mbedtls_sha1;
          (*pmVar43->calc_verify)(ssl,(uchar *)hash_00);
          if (ssl->minor_ver == 3) {
            bVar48 = ssl->transform_negotiate->ciphersuite_info->mac == MBEDTLS_MD_SHA384;
            mVar32 = bVar48 | MBEDTLS_MD_SHA256;
            ssl->out_msg[4] = bVar48 | 4;
            pmVar21 = mbedtls_ssl_own_key(ssl);
            uVar11 = mbedtls_ssl_sig_from_pk(pmVar21);
            ssl->out_msg[5] = uVar11;
            lVar33 = 2;
            sVar19 = 0;
          }
          else {
            pmVar21 = mbedtls_ssl_own_key(ssl);
            mVar32 = MBEDTLS_MD_SHA1;
            iVar16 = mbedtls_pk_can_do(pmVar21,MBEDTLS_PK_ECDSA);
            if (iVar16 == 0) {
              sVar19 = 0x24;
              lVar33 = 0;
              mVar32 = MBEDTLS_MD_NONE;
            }
            else {
              sVar19 = 0x14;
              hash_00 = (mbedtls_sha1_context *)(mbedtls_sha1.state + 2);
              lVar33 = 0;
            }
          }
          pmVar21 = mbedtls_ssl_own_key(ssl);
          iVar16 = mbedtls_pk_sign(pmVar21,mVar32,(uchar *)hash_00,sVar19,ssl->out_msg + lVar33 + 6,
                                   (size_t *)&mbedtls_md5,
                                   (_func_int_void_ptr_uchar_ptr_size_t *)ssl->conf->f_rng,
                                   ssl->conf->p_rng);
          if (iVar16 == 0) {
            ssl->out_msg[lVar33 + 4] = mbedtls_md5.total[0]._1_1_;
            ssl->out_msg[lVar33 + 5] = (uchar)mbedtls_md5.total[0];
            ssl->out_msglen = lVar33 + 6 + (long)mbedtls_md5.total;
            ssl->out_msgtype = 0x16;
            *ssl->out_msg = '\x0f';
            ssl->state = ssl->state + 1;
            iVar16 = mbedtls_ssl_write_record(ssl);
            if (iVar16 == 0) {
              pcVar35 = "<= write certificate verify";
              iVar16 = 0;
              iVar15 = 2;
              line = 0xc58;
              goto LAB_00120bb2;
            }
            pcVar35 = "mbedtls_ssl_write_record";
            iVar15 = 0xc54;
          }
          else {
            pcVar35 = "mbedtls_pk_sign";
            iVar15 = 0xc45;
          }
          goto LAB_00120771;
        }
        pcVar35 = "<= skip write certificate verify";
        iVar16 = 0xbe7;
      }
LAB_0011efc4:
      mbedtls_debug_print_msg
                (ssl,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                 ,iVar16,pcVar35);
      ssl->state = ssl->state + 1;
      return 0;
    }
    pcVar35 = "mbedtls_ssl_derive_keys";
    iVar15 = 0xbd6;
    goto LAB_00120771;
  case 10:
    iVar16 = mbedtls_ssl_write_change_cipher_spec(ssl);
    return iVar16;
  case 0xb:
    iVar16 = mbedtls_ssl_write_finished(ssl);
    return iVar16;
  case 0xc:
    break;
  case 0xd:
    iVar16 = mbedtls_ssl_parse_finished(ssl);
    return iVar16;
  case 0xe:
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
               ,0xd3e,"handshake: done");
    ssl->state = 0xf;
    return 0;
  case 0xf:
    mbedtls_ssl_handshake_wrapup(ssl);
    return 0;
  default:
    pcVar35 = "invalid state %d";
    iVar16 = 0xd47;
LAB_0011ebb5:
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
               ,iVar16,pcVar35,uVar36);
    return -0x7100;
  case 0x11:
    goto switchD_0011e881_caseD_11;
  }
  if (ssl->handshake->new_session_ticket == 0) {
    iVar16 = mbedtls_ssl_parse_change_cipher_spec(ssl);
    return iVar16;
  }
  ssl->state = 0x11;
switchD_0011e881_caseD_11:
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
             ,0xc6c,"=> parse new session ticket");
  iVar16 = mbedtls_ssl_read_record(ssl);
  if (iVar16 != 0) {
    pcVar35 = "mbedtls_ssl_read_record";
    iVar15 = 0xc70;
LAB_00120771:
    mbedtls_debug_print_ret
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
               ,iVar15,pcVar35,iVar16);
    return iVar16;
  }
  if (ssl->in_msgtype != 0x16) {
    pcVar35 = "bad new session ticket message";
    iVar16 = 1;
    iVar15 = 0xc76;
LAB_00120c2b:
    mbedtls_debug_print_msg
              (ssl,iVar16,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
               ,iVar15,pcVar35);
    return -0x7700;
  }
  puVar40 = ssl->in_msg;
  if (*puVar40 == '\x04') {
    uVar37 = (ulong)((ssl->conf->field_0x174 & 2) >> 1) * 8;
    uVar36 = uVar37 + 10;
    if (uVar36 <= ssl->in_hslen) {
      uVar37 = uVar37 | 4;
      uVar47 = (ulong)(ushort)(*(ushort *)(puVar40 + uVar37 + 4) << 8 |
                              *(ushort *)(puVar40 + uVar37 + 4) >> 8);
      if (uVar36 + uVar47 == ssl->in_hslen) {
        uVar18 = *(uint *)(puVar40 + uVar37);
        mbedtls_debug_print_msg
                  (ssl,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                   ,0xc98,"ticket length: %d",uVar47);
        ssl->handshake->new_session_ticket = 0;
        ssl->state = 0xc;
        if (uVar47 == 0) {
          return 0;
        }
        puVar23 = ssl->session_negotiate->ticket;
        sVar19 = ssl->session_negotiate->ticket_len;
        for (sVar31 = 0; sVar19 != sVar31; sVar31 = sVar31 + 1) {
          puVar23[sVar31] = '\0';
        }
        free(ssl->session_negotiate->ticket);
        pmVar7 = ssl->session_negotiate;
        puVar23 = (uchar *)calloc(1,uVar47);
        pmVar7->ticket = (uchar *)0x0;
        pmVar7->ticket_len = 0;
        if (puVar23 == (uchar *)0x0) {
          mbedtls_debug_print_msg
                    (ssl,1,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                     ,0xcad,"ticket alloc failed");
          return -0x7f00;
        }
        memcpy(puVar23,puVar40 + uVar37 + 6,uVar47);
        pmVar7->ticket = puVar23;
        pmVar7->ticket_len = uVar47;
        pmVar7->ticket_lifetime =
             uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 | uVar18 << 0x18;
        iVar16 = 0;
        mbedtls_debug_print_msg
                  (ssl,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                   ,0xcbc,"ticket in use, discarding session id");
        ssl->session_negotiate->id_len = 0;
        pcVar35 = "<= parse new session ticket";
        iVar15 = 2;
        line = 0xcbf;
LAB_00120bb2:
        mbedtls_debug_print_msg
                  (ssl,iVar15,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                   ,line,pcVar35);
        return iVar16;
      }
      iVar16 = 0xc94;
      goto LAB_0011ee92;
    }
  }
  iVar16 = 0xc87;
LAB_0011ee92:
  mbedtls_debug_print_msg
            (ssl,1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
             ,iVar16,"bad new session ticket message");
  return -0x6e00;
}

Assistant:

int mbedtls_ssl_handshake_client_step( mbedtls_ssl_context *ssl )
{
    int ret = 0;

    if( ssl->state == MBEDTLS_SSL_HANDSHAKE_OVER || ssl->handshake == NULL )
        return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "client state: %d", ssl->state ) );

    if( ( ret = mbedtls_ssl_flush_output( ssl ) ) != 0 )
        return( ret );

#if defined(MBEDTLS_SSL_PROTO_DTLS)
    if( ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM &&
        ssl->handshake->retransmit_state == MBEDTLS_SSL_RETRANS_SENDING )
    {
        if( ( ret = mbedtls_ssl_resend( ssl ) ) != 0 )
            return( ret );
    }
#endif

    /* Change state now, so that it is right in mbedtls_ssl_read_record(), used
     * by DTLS for dropping out-of-sequence ChangeCipherSpec records */
#if defined(MBEDTLS_SSL_SESSION_TICKETS)
    if( ssl->state == MBEDTLS_SSL_SERVER_CHANGE_CIPHER_SPEC &&
        ssl->handshake->new_session_ticket != 0 )
    {
        ssl->state = MBEDTLS_SSL_SERVER_NEW_SESSION_TICKET;
    }
#endif

    switch( ssl->state )
    {
        case MBEDTLS_SSL_HELLO_REQUEST:
            ssl->state = MBEDTLS_SSL_CLIENT_HELLO;
            break;

       /*
        *  ==>   ClientHello
        */
       case MBEDTLS_SSL_CLIENT_HELLO:
           ret = ssl_write_client_hello( ssl );
           break;

       /*
        *  <==   ServerHello
        *        Certificate
        *      ( ServerKeyExchange  )
        *      ( CertificateRequest )
        *        ServerHelloDone
        */
       case MBEDTLS_SSL_SERVER_HELLO:
           ret = ssl_parse_server_hello( ssl );
           break;

       case MBEDTLS_SSL_SERVER_CERTIFICATE:
           ret = mbedtls_ssl_parse_certificate( ssl );
           break;

       case MBEDTLS_SSL_SERVER_KEY_EXCHANGE:
           ret = ssl_parse_server_key_exchange( ssl );
           break;

       case MBEDTLS_SSL_CERTIFICATE_REQUEST:
           ret = ssl_parse_certificate_request( ssl );
           break;

       case MBEDTLS_SSL_SERVER_HELLO_DONE:
           ret = ssl_parse_server_hello_done( ssl );
           break;

       /*
        *  ==> ( Certificate/Alert  )
        *        ClientKeyExchange
        *      ( CertificateVerify  )
        *        ChangeCipherSpec
        *        Finished
        */
       case MBEDTLS_SSL_CLIENT_CERTIFICATE:
           ret = mbedtls_ssl_write_certificate( ssl );
           break;

       case MBEDTLS_SSL_CLIENT_KEY_EXCHANGE:
           ret = ssl_write_client_key_exchange( ssl );
           break;

       case MBEDTLS_SSL_CERTIFICATE_VERIFY:
           ret = ssl_write_certificate_verify( ssl );
           break;

       case MBEDTLS_SSL_CLIENT_CHANGE_CIPHER_SPEC:
           ret = mbedtls_ssl_write_change_cipher_spec( ssl );
           break;

       case MBEDTLS_SSL_CLIENT_FINISHED:
           ret = mbedtls_ssl_write_finished( ssl );
           break;

       /*
        *  <==   ( NewSessionTicket )
        *        ChangeCipherSpec
        *        Finished
        */
#if defined(MBEDTLS_SSL_SESSION_TICKETS)
       case MBEDTLS_SSL_SERVER_NEW_SESSION_TICKET:
           ret = ssl_parse_new_session_ticket( ssl );
           break;
#endif

       case MBEDTLS_SSL_SERVER_CHANGE_CIPHER_SPEC:
           ret = mbedtls_ssl_parse_change_cipher_spec( ssl );
           break;

       case MBEDTLS_SSL_SERVER_FINISHED:
           ret = mbedtls_ssl_parse_finished( ssl );
           break;

       case MBEDTLS_SSL_FLUSH_BUFFERS:
           MBEDTLS_SSL_DEBUG_MSG( 2, ( "handshake: done" ) );
           ssl->state = MBEDTLS_SSL_HANDSHAKE_WRAPUP;
           break;

       case MBEDTLS_SSL_HANDSHAKE_WRAPUP:
           mbedtls_ssl_handshake_wrapup( ssl );
           break;

       default:
           MBEDTLS_SSL_DEBUG_MSG( 1, ( "invalid state %d", ssl->state ) );
           return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );
   }

    return( ret );
}